

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,Ea<(moira::Mode)9,_(moira::Size)4> *ea)

{
  u32 uVar1;
  u32 uVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  StrWriter *pSVar6;
  StrWriter local_48;
  
  pSVar6 = &local_48;
  pcVar3 = this->ptr;
  this->ptr = pcVar3 + 1;
  *pcVar3 = '(';
  operator<<(this,(Int)(int)(short)ea->ext1);
  cVar4 = ',';
  lVar5 = 0;
  do {
    pcVar3 = this->ptr;
    this->ptr = pcVar3 + 1;
    *pcVar3 = cVar4;
    cVar4 = ",PC)"[lVar5 + 1];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  uVar1 = ea->pc;
  uVar2 = ea->ext1;
  local_48.hex = this->hex;
  local_48.upper = this->upper;
  local_48.comment[0] = '\0';
  cVar4 = ';';
  lVar5 = 1;
  local_48.ptr = this->comment;
  do {
    pcVar3 = local_48.ptr;
    *local_48.ptr = cVar4;
    cVar4 = "; ("[lVar5];
    lVar5 = lVar5 + 1;
    local_48.ptr = (char *)(pcVar3 + 1);
  } while (lVar5 != 4);
  local_48.base = this->comment;
  operator<<(&local_48,(UInt)(uVar1 + 2 + (int)(short)uVar2));
  *local_48.ptr = ')';
  pcVar3 = local_48.ptr + 1;
  while (local_48.comment[0] != '\0') {
    pSVar6 = (StrWriter *)((long)pSVar6 + 1);
    local_48.ptr = pcVar3 + 1;
    *pcVar3 = local_48.comment[0];
    pcVar3 = local_48.ptr;
    local_48.comment[0] = *(char *)pSVar6;
  }
  *pcVar3 = '\0';
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(const Ea<M,S> &ea)
{
    switch (M) {

        case 0: // Dn
        {
            *this << Dn{ea.reg};
            break;
        }
        case 1: // An
        {
            *this << An{ea.reg};
            break;
        }
        case 2: // (An)
        {
            *this << "(" << An{ea.reg} << ")";
            break;
        }
        case 3:  // (An)+
        {
            *this << "(" << An{ea.reg} << ")+";
            break;
        }
        case 4: // -(An)
        {
            *this << "-(" << An{ea.reg} << ")";
            break;
        }
        case 5: // (d,An)
        {
            *this << "(" << Int{(i16)ea.ext1};
            *this << "," << An{ea.reg} << ")";
            break;
        }
        case 6: // (d,An,Xi)
        {
            (ea.ext1 & 0x100) ? fullExtension(ea) : briefExtension(ea);
            break;
        }
        case 7: // ABS.W
        {
            *this << UInt(ea.ext1);
            *this << (upper ? ".W" : ".w");
            break;
        }
        case 8: // ABS.L
        {
            *this << UInt(ea.ext1);
            *this << (upper ? ".L" : ".l");
            break;
        }
        case 9: // (d,PC)
        {
            *this << "(" << Int{(i16)ea.ext1} << ",PC)";
            auto resolved = UInt(ea.pc + (i16)ea.ext1 + 2);
            StrWriter(comment, hex, upper) << "; (" << resolved << ")" << Finish{};
            break;
        }
        case 10: // (d,PC,Xi)
        {
            (ea.ext1 & 0x100) ? fullExtension(ea) : briefExtension(ea);
            break;
        }
        case 11: // Imm
        {
            *this << Imu(ea.ext1);
            break;
        }
    }
    return *this;
}